

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linuxaio_queue.cpp
# Opt level: O0

void __thiscall foxxll::linuxaio_queue::~linuxaio_queue(linuxaio_queue *this)

{
  linuxaio_queue *this_local;
  
  (this->super_request_queue_impl_worker).super_request_queue._vptr_request_queue =
       (_func_int **)&PTR_add_request_001e5f70;
  request_queue_impl_worker::stop_thread
            (&this->super_request_queue_impl_worker,&this->post_thread_,&this->post_thread_state_,
             &this->num_waiting_requests_);
  request_queue_impl_worker::stop_thread
            (&this->super_request_queue_impl_worker,&this->wait_thread_,&this->wait_thread_state_,
             &this->num_posted_requests_);
  syscall(0xcf,this->context_);
  shared_state<foxxll::request_queue_impl_worker::thread_state>::~shared_state
            (&this->wait_thread_state_);
  shared_state<foxxll::request_queue_impl_worker::thread_state>::~shared_state
            (&this->post_thread_state_);
  std::thread::~thread(&this->wait_thread_);
  std::thread::~thread(&this->post_thread_);
  tlx::Semaphore::~Semaphore(&this->num_posted_requests_);
  tlx::Semaphore::~Semaphore(&this->num_free_events_);
  tlx::Semaphore::~Semaphore(&this->num_waiting_requests_);
  std::__cxx11::
  list<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>,_std::allocator<tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>_>_>
  ::~list(&this->waiting_requests_);
  request_queue_impl_worker::~request_queue_impl_worker(&this->super_request_queue_impl_worker);
  return;
}

Assistant:

linuxaio_queue::~linuxaio_queue()
{
    stop_thread(post_thread_, post_thread_state_, num_waiting_requests_);
    stop_thread(wait_thread_, wait_thread_state_, num_posted_requests_);
    syscall(SYS_io_destroy, context_);
}